

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

bool match_one_ph(Am_Value *target_value,Am_Value *current_value)

{
  bool bVar1;
  ostream *poVar2;
  bool local_46;
  Am_Object local_38;
  byte local_29;
  Am_Object local_28;
  Am_Value *local_20;
  Am_Value *current_value_local;
  Am_Value *target_value_local;
  
  local_29 = 0;
  local_46 = false;
  local_20 = current_value;
  current_value_local = target_value;
  if (target_value->type == 0xa001) {
    Am_Object::Am_Object(&local_28,target_value);
    local_29 = 1;
    Am_Object::Am_Object(&local_38,&Am_A_Placeholder);
    local_46 = Am_Object::Is_Instance_Of(&local_28,&local_38);
    Am_Object::~Am_Object(&local_38);
  }
  if ((local_29 & 1) != 0) {
    Am_Object::~Am_Object(&local_28);
  }
  if (local_46 == false) {
    bVar1 = Am_Value::operator!=(current_value_local,local_20);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  Doesn\'t match\n");
      std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
      return false;
    }
  }
  else {
    bVar1 = match_place_holder(current_value_local,local_20);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  Placeholder Doesn\'t match\n");
      std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
      return false;
    }
  }
  return true;
}

Assistant:

bool
match_one_ph(Am_Value &target_value, Am_Value &current_value)
{
  if (target_value.type == Am_OBJECT &&
      Am_Object(target_value).Is_Instance_Of(Am_A_Placeholder)) {
    if (!match_place_holder(target_value, current_value)) {
      std::cout << "  Placeholder Doesn't match\n" << std::flush;
      return false; // doesn't match
    }
  } else if (target_value != current_value) {
    std::cout << "  Doesn't match\n" << std::flush;
    return false; // doesn't match
  }
  return true;
}